

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_transfer.cpp
# Opt level: O0

void Omega_h::transfer_no_products_tmpl<int>
               (Mesh *old_mesh,Mesh *new_mesh,Int prod_dim,LOs *same_ents2old_ents,
               LOs *same_ents2new_ents,TagBase *tagbase)

{
  void *tagbase_00;
  Read<int> local_120;
  Read<int> local_110;
  Read<int> local_100;
  Read<int> local_f0;
  allocator local_d9;
  string local_d8 [32];
  initializer_list<int> local_b8;
  undefined1 local_a8 [8];
  Read<int> prod_data;
  allocator local_81;
  string local_80 [32];
  initializer_list<int> local_60;
  undefined1 local_50 [8];
  LOs prods2new_ents;
  Tag<int> *old_tag;
  TagBase *tagbase_local;
  LOs *same_ents2new_ents_local;
  LOs *same_ents2old_ents_local;
  Int prod_dim_local;
  Mesh *new_mesh_local;
  Mesh *old_mesh_local;
  
  prods2new_ents.write_.shared_alloc_.direct_ptr = as<int>(tagbase);
  std::initializer_list<int>::initializer_list(&local_60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"",&local_81);
  Read<int>::Read((Read<int> *)local_50,local_60,(string *)local_80);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::initializer_list<int>::initializer_list(&local_b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,"",&local_d9);
  Read<int>::Read((Read<int> *)local_a8,local_b8,(string *)local_d8);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  Read<int>::Read(&local_f0,same_ents2old_ents);
  Read<int>::Read(&local_100,same_ents2new_ents);
  Read<int>::Read(&local_110,(Read<int> *)local_50);
  tagbase_00 = prods2new_ents.write_.shared_alloc_.direct_ptr;
  Read<int>::Read(&local_120,(Read<int> *)local_a8);
  transfer_common<int>
            (old_mesh,new_mesh,prod_dim,&local_f0,&local_100,&local_110,(TagBase *)tagbase_00,
             &local_120);
  Read<int>::~Read(&local_120);
  Read<int>::~Read(&local_110);
  Read<int>::~Read(&local_100);
  Read<int>::~Read(&local_f0);
  Read<int>::~Read((Read<int> *)local_a8);
  Read<int>::~Read((Read<int> *)local_50);
  return;
}

Assistant:

static void transfer_no_products_tmpl(Mesh* old_mesh, Mesh* new_mesh,
    Int prod_dim, LOs same_ents2old_ents, LOs same_ents2new_ents,
    TagBase const* tagbase) {
  auto old_tag = as<T>(tagbase);
  auto prods2new_ents = LOs({});
  auto prod_data = Read<T>({});
  transfer_common(old_mesh, new_mesh, prod_dim, same_ents2old_ents,
      same_ents2new_ents, prods2new_ents, old_tag, prod_data);
}